

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall
SVGChart::PlotDataContainer::CalculateYRangePlot
          (PlotDataContainer *this,float inXMin,float inXMax,PlotDataBase *inXData,
          PlotDataBase *inYData,float *outYMin,float *outYMax)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  
  *outYMin = 0.0;
  *outYMax = 0.0;
  lVar1 = PlotDataBase::GetSize(inXData);
  lVar2 = PlotDataBase::GetSize(inYData);
  if ((lVar1 == lVar2) && (lVar3 = PlotDataBase::GetSize(inXData), 0 < lVar3)) {
    bVar5 = false;
    lVar3 = 0;
    do {
      fVar6 = PlotDataBase::GetValue(inXData,lVar3);
      fVar7 = PlotDataBase::GetValue(inYData,lVar3);
      if ((inXMin <= fVar6) && (fVar6 <= inXMax)) {
        if (bVar5) {
          if (fVar7 < *outYMin) {
            *outYMin = fVar7;
          }
          if (fVar7 < *outYMax || fVar7 == *outYMax) goto LAB_00104d43;
        }
        else {
          *outYMin = fVar7;
          bVar5 = true;
        }
        *outYMax = fVar7;
      }
LAB_00104d43:
      lVar3 = lVar3 + 1;
      lVar4 = PlotDataBase::GetSize(inXData);
    } while (lVar3 < lVar4);
  }
  return lVar1 == lVar2;
}

Assistant:

bool PlotDataContainer::CalculateYRangePlot (float inXMin, float inXMax, const PlotDataBase &inXData, const PlotDataBase &inYData, float &outYMin, float &outYMax) const {
        outYMin = 0;
        outYMax = 0;
        // bool theEnteredXRange = false;
        bool initialized = false;
        
        if (inXData.GetSize () != inYData.GetSize ()) {
            return false;
        }

        for (long theI = 0; theI < inXData.GetSize (); theI++) {
            float theX = inXData.GetValue (theI);
            float theY = inYData.GetValue (theI);
            
            if (theX>=inXMin && theX <= inXMax) {
                if (!initialized) {
                    initialized = true;
                    outYMin = theY;
                    outYMax = theY;
                } else {
                    if (theY<outYMin) {
                        outYMin = theY;
                    }
                    if (theY>outYMax) {
                        outYMax = theY;
                    }
                }
            }
        }
        return true;
    }